

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::StratifiedSampler::Get2D(StratifiedSampler *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM3 [64];
  
  uVar9 = (long)this->seed ^ (long)this->dimension << 0x10 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30;
  uVar9 = (uVar9 >> 0x1f ^ uVar9) * 0x7fb5d329728ea185;
  lVar10 = (uVar9 >> 0x1b ^ uVar9) * -0x7e25210b43d22bb3;
  uVar8 = (uint)((ulong)lVar10 >> 0x21) ^ (uint)lVar10;
  uVar6 = this->sampleIndex;
  uVar2 = this->xPixelSamples;
  uVar3 = this->yPixelSamples;
  auVar13._4_4_ = uVar3;
  auVar13._0_4_ = uVar2;
  uVar11 = uVar3 * uVar2;
  uVar12 = uVar11 - 1 >> 1 | uVar11 - 1;
  uVar12 = uVar12 >> 2 | uVar12;
  uVar12 = uVar12 >> 4 | uVar12;
  uVar12 = uVar12 >> 8 | uVar12;
  uVar12 = uVar12 >> 0x10 | uVar12;
  do {
    uVar6 = (uVar6 ^ uVar8) * -0x1e8f76c3 ^ uVar8 >> 0x10;
    uVar6 = ((uVar6 & uVar12) >> 4 ^ uVar8 >> 8 ^ uVar6) * 0x929eb3f ^ uVar8 >> 0x17;
    uVar6 = ((uVar6 & uVar12) >> 1 ^ uVar6) * (uVar8 >> 0x1b | 1) * 0x6935fa69;
    uVar6 = ((uVar6 & uVar12) >> 0xb ^ uVar6) * 0x74dcb303;
    uVar6 = ((uVar6 & uVar12) >> 2 ^ uVar6) * -0x61afe33d;
    uVar6 = ((uVar6 & uVar12) >> 2 ^ uVar6) * -0x379f5c21 & uVar12;
    uVar6 = uVar6 >> 5 ^ uVar6;
  } while (uVar11 <= uVar6);
  this->dimension = this->dimension + 2;
  bVar1 = this->jitter;
  auVar14 = SUB6416(ZEXT464(0x3f000000),0);
  auVar5 = auVar14;
  if (bVar1 == true) {
    uVar9 = (this->rng).state;
    (this->rng).state = uVar9 * 0x5851f42d4c957f2d + (this->rng).inc;
    uVar12 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
    bVar7 = (byte)(uVar9 >> 0x3b);
    auVar5 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,uVar12 >> bVar7 | uVar12 << 0x20 - bVar7);
    auVar5 = vminss_avx(ZEXT416((uint)(auVar5._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  }
  if (bVar1 != false) {
    uVar9 = (this->rng).state;
    (this->rng).state = uVar9 * 0x5851f42d4c957f2d + (this->rng).inc;
    uVar12 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
    bVar7 = (byte)(uVar9 >> 0x3b);
    auVar14 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,uVar12 >> bVar7 | uVar12 << 0x20 - bVar7);
    auVar14 = vminss_avx(ZEXT416((uint)(auVar14._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  }
  uVar11 = (uVar6 + uVar8) % uVar11;
  auVar4 = vpinsrd_avx(ZEXT416((uint)((int)uVar11 % (int)uVar2)),(int)uVar11 / (int)uVar2,1);
  auVar13._8_8_ = 0;
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vinsertps_avx(auVar5,auVar14,0x10);
  auVar14._0_4_ = auVar5._0_4_ + auVar4._0_4_;
  auVar14._4_4_ = auVar5._4_4_ + auVar4._4_4_;
  auVar14._8_4_ = auVar5._8_4_ + auVar4._8_4_;
  auVar14._12_4_ = auVar5._12_4_ + auVar4._12_4_;
  auVar13 = vdivps_avx(auVar14,auVar13);
  return (Point2f)auVar13._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Compute _stratum_ index for current pixel and dimension
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ seed);
        int stratum = PermutationElement(sampleIndex, SamplesPerPixel(), hash);

        dimension += 2;
        int x = stratum % xPixelSamples, y = stratum / xPixelSamples;
        Float dx = jitter ? rng.Uniform<Float>() : 0.5f;
        Float dy = jitter ? rng.Uniform<Float>() : 0.5f;
        return {(x + dx) / xPixelSamples, (y + dy) / yPixelSamples};
    }